

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall google::protobuf::OneofOptions::InternalSwap(OneofOptions *this,OneofOptions *other)

{
  InternalMetadataWithArena *this_00;
  uint32 uVar1;
  int iVar2;
  void *pvVar3;
  Rep *pRVar4;
  UnknownFieldSet *other_00;
  
  internal::ExtensionSet::Swap(&this->_extensions_,&other->_extensions_);
  this_00 = &other->_internal_metadata_;
  if ((((ulong)(this->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_ & 1) != 0) ||
     (((ulong)(this_00->
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              ).ptr_ & 1) != 0)) {
    pvVar3 = (this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_;
    if (((ulong)pvVar3 & 1) == 0) {
      other_00 = internal::
                 InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                 ::mutable_unknown_fields_slow
                           (&this_00->
                             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                           );
    }
    else {
      other_00 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
    }
    internal::InternalMetadataWithArena::DoSwap(&this->_internal_metadata_,other_00);
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar1;
  pRVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_ =
       (other->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
  (other->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_ = pRVar4;
  iVar2 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ =
       (other->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  (other->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar2;
  iVar2 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_;
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_ =
       (other->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_;
  (other->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_ = iVar2;
  return;
}

Assistant:

void OneofOptions::InternalSwap(OneofOptions* other) {
  using std::swap;
  _extensions_.Swap(&other->_extensions_);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  uninterpreted_option_.InternalSwap(&other->uninterpreted_option_);
}